

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chameleon-core.cpp
# Opt level: O0

particles * read_particles(char *charfilename)

{
  undefined1 auVar1 [16];
  bool bVar2;
  long *plVar3;
  particles *ppVar4;
  size_type sVar5;
  ulong uVar6;
  particle *ppVar7;
  reference pvVar8;
  ostream *poVar9;
  char *in_RDI;
  particles *p_1;
  long i;
  particles *p;
  vector<double,_std::allocator<double>_> v;
  double a;
  fstream fs;
  string filename;
  value_type_conflict *in_stack_fffffffffffffd18;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd20;
  ulong local_288;
  vector<double,_std::allocator<double>_> local_278;
  double local_260;
  long local_258 [68];
  allocator local_31;
  string local_30 [40];
  particles *local_8;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,in_RDI,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::fstream::fstream(local_258,local_30,_S_in);
  bVar2 = std::ios::operator_cast_to_bool
                    ((ios *)((long)local_258 + *(long *)(local_258[0] + -0x18)));
  if (bVar2) {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x10a5e9);
    while( true ) {
      plVar3 = (long *)std::istream::operator>>((istream *)local_258,&local_260);
      bVar2 = std::ios::operator_cast_to_bool((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
      if (!bVar2) break;
      std::vector<double,_std::allocator<double>_>::push_back
                (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    }
    std::fstream::close();
    ppVar4 = (particles *)operator_new(0x10);
    sVar5 = std::vector<double,_std::allocator<double>_>::size(&local_278);
    ppVar4->n = sVar5 / 9;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = ppVar4->n;
    uVar6 = SUB168(auVar1 * ZEXT816(0x48),0);
    if (SUB168(auVar1 * ZEXT816(0x48),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    ppVar7 = (particle *)operator_new__(uVar6);
    ppVar4->p = ppVar7;
    local_288 = 0;
    while( true ) {
      sVar5 = std::vector<double,_std::allocator<double>_>::size(&local_278);
      if (sVar5 / 9 <= local_288) break;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](&local_278,local_288 * 9);
      ppVar4->p[local_288].q = *pvVar8;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&local_278,local_288 * 9 + 1);
      ppVar4->p[local_288].x = *pvVar8;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&local_278,local_288 * 9 + 2);
      ppVar4->p[local_288].y = *pvVar8;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&local_278,local_288 * 9 + 3);
      ppVar4->p[local_288].z = *pvVar8;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&local_278,local_288 * 9 + 4);
      ppVar4->p[local_288].ux = *pvVar8;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&local_278,local_288 * 9 + 5);
      ppVar4->p[local_288].uy = *pvVar8;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&local_278,local_288 * 9 + 6);
      ppVar4->p[local_288].uz = *pvVar8;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&local_278,local_288 * 9 + 7);
      ppVar4->p[local_288].g = *pvVar8;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&local_278,local_288 * 9 + 8);
      ppVar4->p[local_288].chi = *pvVar8;
      local_288 = local_288 + 1;
    }
    local_8 = ppVar4;
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffd20);
  }
  else {
    poVar9 = std::operator<<((ostream *)&std::cerr,
                             "libchameleon: read_particles: ERROR: no such file, ");
    poVar9 = std::operator<<(poVar9,local_30);
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    std::fstream::close();
    local_8 = (particles *)operator_new(0x10);
    local_8->n = 0;
    local_8->p = (particle *)0x0;
  }
  std::fstream::~fstream(local_258);
  std::__cxx11::string::~string(local_30);
  return local_8;
}

Assistant:

particles* read_particles(const char* charfilename) { // char* ptype?
    string filename(charfilename);
    fstream fs(filename, ios_base::in);
    if (fs) {
        double a;
        std::vector<double> v;
        while (fs >> a) {
            v.push_back(a);
        }
        fs.close();
        particles* p = new particles;
        p -> n = v.size() / 9;
        p -> p = new particle[p -> n];
        for (long i = 0; i < v.size() / 9; ++i) {
            (p -> p)[i].q = v[9 * i];
            (p -> p)[i].x = v[9 * i + 1];
            (p -> p)[i].y = v[9 * i + 2];
            (p -> p)[i].z = v[9 * i + 3];
            (p -> p)[i].ux = v[9 * i + 4];
            (p -> p)[i].uy = v[9 * i + 5];
            (p -> p)[i].uz = v[9 * i + 6];
            (p -> p)[i].g = v[9 * i + 7];
            (p -> p)[i].chi = v[9 * i + 8];
        }
        return p;
    } else {
        cerr << "libchameleon: read_particles: ERROR: no such file, " << filename <<
            endl;
        fs.close();
        particles* p = new particles;
        p -> n = 0;
        p -> p = nullptr;
        return p;
    }
}